

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

void __thiscall gvr::PointCloud::addExtend(PointCloud *this,Vector3d *emin,Vector3d *emax)

{
  double dVar1;
  float *pfVar2;
  double *pdVar3;
  Vector3d *pVVar4;
  SVector<double,_3> *in_RDX;
  SVector<double,_3> *in_RSI;
  Model *in_RDI;
  float z_1;
  float y_1;
  float x_1;
  int i_1;
  float zmean;
  float ymean;
  float xmean;
  int m;
  int nzmin;
  int nymin;
  int nxmin;
  float z;
  float y;
  float x;
  int i;
  float zmax;
  float ymax;
  float xmax;
  float zmin;
  float ymin;
  float xmin;
  bool repeat;
  float pzmax;
  float pymax;
  float pxmax;
  float pzmin;
  float pymin;
  float pxmin;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  float local_88;
  float local_84;
  float local_80;
  int local_7c;
  float local_78;
  float local_74;
  float local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  float local_58;
  float local_54;
  int local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  byte local_31;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  SVector<double,_3> *local_18;
  SVector<double,_3> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = std::numeric_limits<float>::max();
  local_1c = -local_1c;
  local_20 = std::numeric_limits<float>::max();
  local_20 = -local_20;
  local_24 = std::numeric_limits<float>::max();
  local_24 = -local_24;
  local_28 = std::numeric_limits<float>::max();
  local_2c = std::numeric_limits<float>::max();
  local_30 = std::numeric_limits<float>::max();
  local_31 = 1;
  while ((local_31 & 1) != 0) {
    local_31 = 0;
    local_38 = std::numeric_limits<float>::max();
    local_3c = std::numeric_limits<float>::max();
    local_40 = std::numeric_limits<float>::max();
    local_44 = std::numeric_limits<float>::max();
    local_44 = -local_44;
    local_48 = std::numeric_limits<float>::max();
    local_48 = -local_48;
    local_4c = std::numeric_limits<float>::max();
    local_4c = -local_4c;
    for (local_50 = (*(int *)&in_RDI[1]._vptr_Model + -1) * 3; -1 < local_50;
        local_50 = local_50 + -3) {
      local_54 = *(float *)(*(long *)&in_RDI[1].id + (long)local_50 * 4);
      local_58 = *(float *)(*(long *)&in_RDI[1].id + (long)(local_50 + 1) * 4);
      local_5c = *(float *)(*(long *)&in_RDI[1].id + (long)(local_50 + 2) * 4);
      if ((((local_1c <= local_54) && (local_54 < local_28)) && (local_20 <= local_58)) &&
         (((local_58 < local_2c && (local_24 <= local_5c)) && (local_5c < local_30)))) {
        pfVar2 = std::min<float>(&local_38,&local_54);
        local_38 = *pfVar2;
        pfVar2 = std::min<float>(&local_3c,&local_58);
        local_3c = *pfVar2;
        pfVar2 = std::min<float>(&local_40,&local_5c);
        local_40 = *pfVar2;
        pfVar2 = std::max<float>(&local_44,&local_54);
        local_44 = *pfVar2;
        pfVar2 = std::max<float>(&local_48,&local_58);
        local_48 = *pfVar2;
        pfVar2 = std::max<float>(&local_4c,&local_5c);
        local_4c = *pfVar2;
      }
    }
    if (((local_38 <= local_44) && (local_3c <= local_48)) && (local_40 <= local_4c)) {
      local_60 = 0;
      local_64 = 0;
      local_68 = 0;
      local_6c = 0;
      local_70 = (local_44 + local_38) / 2.0;
      local_74 = (local_48 + local_3c) / 2.0;
      local_78 = (local_4c + local_40) / 2.0;
      for (local_7c = (*(int *)&in_RDI[1]._vptr_Model + -1) * 3; -1 < local_7c;
          local_7c = local_7c + -3) {
        local_80 = *(float *)(*(long *)&in_RDI[1].id + (long)local_7c * 4);
        local_84 = *(float *)(*(long *)&in_RDI[1].id + (long)(local_7c + 1) * 4);
        local_88 = *(float *)(*(long *)&in_RDI[1].id + (long)(local_7c + 2) * 4);
        if (((((local_1c <= local_80) && (local_80 < local_28)) && (local_20 <= local_84)) &&
            ((local_84 < local_2c && (local_24 <= local_88)))) && (local_88 < local_30)) {
          if (*(float *)(*(long *)&in_RDI[1].id + (long)local_7c * 4) < local_70) {
            local_60 = local_60 + 1;
          }
          if (*(float *)(*(long *)&in_RDI[1].id + (long)(local_7c + 1) * 4) < local_74) {
            local_64 = local_64 + 1;
          }
          if (*(float *)(*(long *)&in_RDI[1].id + (long)(local_7c + 2) * 4) < local_78) {
            local_68 = local_68 + 1;
          }
          local_6c = local_6c + 1;
        }
      }
      local_1c = local_38;
      local_28 = local_44;
      local_20 = local_3c;
      local_2c = local_48;
      local_24 = local_40;
      local_30 = local_4c;
      if (*(int *)&in_RDI[1]._vptr_Model < local_6c * 2) {
        if (local_38 < local_44) {
          if (local_60 * 100 < local_6c) {
            local_31 = 1;
            local_1c = local_70;
          }
          if ((local_6c - local_60) * 100 < local_6c) {
            local_31 = 1;
            local_28 = local_70;
          }
        }
        if (local_3c < local_48) {
          if (local_64 * 100 < local_6c) {
            local_31 = 1;
            local_20 = local_74;
          }
          if ((local_6c - local_64) * 100 < local_6c) {
            local_31 = 1;
            local_2c = local_74;
          }
        }
        if (local_40 < local_4c) {
          if (local_68 * 100 < local_6c) {
            local_31 = 1;
            local_24 = local_78;
          }
          if ((local_6c - local_68) * 100 < local_6c) {
            local_31 = 1;
            local_30 = local_78;
          }
        }
      }
    }
  }
  pdVar3 = gmath::SVector<double,_3>::operator[](local_10,0);
  pVVar4 = Model::getOrigin(in_RDI);
  local_90 = gmath::SVector<double,_3>::operator[](pVVar4,0);
  local_90 = local_90 + (double)local_1c;
  pdVar3 = std::min<double>(pdVar3,&local_90);
  dVar1 = *pdVar3;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_10,0);
  *pdVar3 = dVar1;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_10,1);
  pVVar4 = Model::getOrigin(in_RDI);
  local_98 = gmath::SVector<double,_3>::operator[](pVVar4,1);
  local_98 = local_98 + (double)local_20;
  pdVar3 = std::min<double>(pdVar3,&local_98);
  dVar1 = *pdVar3;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_10,1);
  *pdVar3 = dVar1;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_10,2);
  pVVar4 = Model::getOrigin(in_RDI);
  local_a0 = gmath::SVector<double,_3>::operator[](pVVar4,2);
  local_a0 = local_a0 + (double)local_24;
  pdVar3 = std::min<double>(pdVar3,&local_a0);
  dVar1 = *pdVar3;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_10,2);
  *pdVar3 = dVar1;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_18,0);
  pVVar4 = Model::getOrigin(in_RDI);
  local_a8 = gmath::SVector<double,_3>::operator[](pVVar4,0);
  local_a8 = local_a8 + (double)local_28;
  pdVar3 = std::max<double>(pdVar3,&local_a8);
  dVar1 = *pdVar3;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_18,0);
  *pdVar3 = dVar1;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_18,1);
  pVVar4 = Model::getOrigin(in_RDI);
  local_b0 = gmath::SVector<double,_3>::operator[](pVVar4,1);
  local_b0 = local_b0 + (double)local_2c;
  pdVar3 = std::max<double>(pdVar3,&local_b0);
  dVar1 = *pdVar3;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_18,1);
  *pdVar3 = dVar1;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_18,2);
  pVVar4 = Model::getOrigin(in_RDI);
  local_b8 = gmath::SVector<double,_3>::operator[](pVVar4,2);
  local_b8 = local_b8 + (double)local_30;
  pdVar3 = std::max<double>(pdVar3,&local_b8);
  dVar1 = *pdVar3;
  pdVar3 = gmath::SVector<double,_3>::operator[](local_18,2);
  *pdVar3 = dVar1;
  return;
}

Assistant:

void PointCloud::addExtend(gmath::Vector3d &emin, gmath::Vector3d &emax) const
{
  float pxmin=-std::numeric_limits<float>::max();
  float pymin=-std::numeric_limits<float>::max();
  float pzmin=-std::numeric_limits<float>::max();
  float pxmax=std::numeric_limits<float>::max();
  float pymax=std::numeric_limits<float>::max();
  float pzmax=std::numeric_limits<float>::max();

  bool repeat=true;
  while (repeat)
  {
    repeat=false;

    // compute extend

    float xmin=std::numeric_limits<float>::max();
    float ymin=std::numeric_limits<float>::max();
    float zmin=std::numeric_limits<float>::max();
    float xmax=-std::numeric_limits<float>::max();
    float ymax=-std::numeric_limits<float>::max();
    float zmax=-std::numeric_limits<float>::max();

    for (int i=3*(n-1); i>=0; i-=3)
    {
      float x=vertex[i];
      float y=vertex[i+1];
      float z=vertex[i+2];

      if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
      {
        xmin=std::min(xmin, x);
        ymin=std::min(ymin, y);
        zmin=std::min(zmin, z);

        xmax=std::max(xmax, x);
        ymax=std::max(ymax, y);
        zmax=std::max(zmax, z);
      }
    }

    if (xmax >= xmin && ymax >= ymin && zmax >= zmin)
    {
      // divide range of each coordinate into two halves compute number of points
      // in each halve

      int nxmin=0;
      int nymin=0;
      int nzmin=0;
      int m=0;

      float xmean=(xmax+xmin)/2;
      float ymean=(ymax+ymin)/2;
      float zmean=(zmax+zmin)/2;

      for (int i=3*(n-1); i>=0; i-=3)
      {
        float x=vertex[i];
        float y=vertex[i+1];
        float z=vertex[i+2];

        if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
        {
          if (vertex[i] < xmean)
          {
            nxmin++;
          }

          if (vertex[i+1] < ymean)
          {
            nymin++;
          }

          if (vertex[i+2] < zmean)
          {
            nzmin++;
          }

          m++;
        }
      }

      pxmin=xmin;
      pxmax=xmax;
      pymin=ymin;
      pymax=ymax;
      pzmin=zmin;
      pzmax=zmax;

      if (2*m > n)
      {
        // reduce range and try again if one half contains less than 1/100 of the
        // points

        if (pxmax > pxmin)
        {
          if (nxmin*100 < m)
          {
            pxmin=xmean;
            repeat=true;
          }

          if ((m-nxmin)*100 < m)
          {
            pxmax=xmean;
            repeat=true;
          }
        }

        if (pymax > pymin)
        {
          if (nymin*100 < m)
          {
            pymin=ymean;
            repeat=true;
          }

          if ((m-nymin)*100 < m)
          {
            pymax=ymean;
            repeat=true;
          }
        }

        if (pzmax > pzmin)
        {
          if (nzmin*100 < m)
          {
            pzmin=zmean;
            repeat=true;
          }

          if ((m-nzmin)*100 < m)
          {
            pzmax=zmean;
            repeat=true;
          }
        }
      }
    }
  }

  // add extend

  emin[0]=std::min(emin[0], getOrigin()[0]+pxmin);
  emin[1]=std::min(emin[1], getOrigin()[1]+pymin);
  emin[2]=std::min(emin[2], getOrigin()[2]+pzmin);

  emax[0]=std::max(emax[0], getOrigin()[0]+pxmax);
  emax[1]=std::max(emax[1], getOrigin()[1]+pymax);
  emax[2]=std::max(emax[2], getOrigin()[2]+pzmax);
}